

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall Js::FunctionBody::InitDisableInlineSpread(FunctionBody *this)

{
  LocalFunctionId LVar1;
  uint sourceContextId;
  bool local_11;
  FunctionBody *this_local;
  
  LVar1 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  local_11 = false;
  if (LVar1 != 0xffffffff) {
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar1 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    local_11 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,sourceContextId,LVar1);
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffdfff | (uint)local_11 << 0xd;
  return;
}

Assistant:

void InitDisableInlineSpread()        { disableInlineSpread = this->GetLocalFunctionId() != Js::Constants::NoFunctionId && PHASE_OFF(Js::InlinePhase, this); }